

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

uint __thiscall xercesc_4_0::XMLURL::getPortNum(XMLURL *this)

{
  uint uVar1;
  
  uVar1 = this->fPortNum;
  if (uVar1 == 0) {
    uVar1 = 0;
    if ((ulong)this->fProtocol != 5) {
      return *(uint *)(&DAT_00402550 + (ulong)this->fProtocol * 0x18);
    }
  }
  return uVar1;
}

Assistant:

unsigned int XMLURL::getPortNum() const
{
    //
    //  If it was not provided explicitly, then lets return the default one
    //  for the protocol.
    //
    if (!fPortNum)
    {
        if (fProtocol == Unknown)
            return 0;
        return gProtoList[fProtocol].defPort;
    }
    return fPortNum;
}